

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
::~raw_hash_set(raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *this)

{
  bool bVar1;
  void *p;
  size_t n;
  
  capacity(this);
  bVar1 = is_soo(this);
  if (bVar1) {
    if (1 < (this->settings_).
            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
            size_) {
      soo_slot(this);
      return;
    }
  }
  else {
    bVar1 = is_soo(this);
    if (bVar1) {
      __assert_fail("!is_soo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdcc,
                    "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::destroy_slots() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                   );
    }
    capacity(this);
    slot_array(this);
    capacity(this);
    bVar1 = is_soo(this);
    if (bVar1) {
      __assert_fail("!is_soo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf89,
                    "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::infoz() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                   );
    }
    CommonFields::infoz((CommonFields *)this);
    p = CommonFields::backing_array_start((CommonFields *)this);
    n = CommonFields::alloc_size((CommonFields *)this,8,8);
    Deallocate<8ul,std::allocator<google::protobuf::FileDescriptor_const*>>
              ((allocator<const_google::protobuf::FileDescriptor_*> *)this,p,n);
  }
  return;
}

Assistant:

~raw_hash_set() { destructor_impl(); }